

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O0

CapturedMouse __thiscall ftxui::ScreenInteractive::CaptureMouse(ScreenInteractive *this)

{
  long in_RSI;
  unique_ptr<ftxui::(anonymous_namespace)::CapturedMouseImpl,_std::default_delete<ftxui::(anonymous_namespace)::CapturedMouseImpl>_>
  local_20 [2];
  ScreenInteractive *this_local;
  
  this_local = this;
  if ((*(byte *)(in_RSI + 0x9c) & 1) == 0) {
    *(undefined1 *)(in_RSI + 0x9c) = 1;
    std::
    make_unique<ftxui::(anonymous_namespace)::CapturedMouseImpl,ftxui::ScreenInteractive::CaptureMouse()::__0>
              ((anon_class_8_1_8991fb9c *)local_20);
    std::
    unique_ptr<ftxui::CapturedMouseInterface,std::default_delete<ftxui::CapturedMouseInterface>>::
    unique_ptr<ftxui::(anonymous_namespace)::CapturedMouseImpl,std::default_delete<ftxui::(anonymous_namespace)::CapturedMouseImpl>,void>
              ((unique_ptr<ftxui::CapturedMouseInterface,std::default_delete<ftxui::CapturedMouseInterface>>
                *)this,local_20);
    std::
    unique_ptr<ftxui::(anonymous_namespace)::CapturedMouseImpl,_std::default_delete<ftxui::(anonymous_namespace)::CapturedMouseImpl>_>
    ::~unique_ptr(local_20);
  }
  else {
    std::
    unique_ptr<ftxui::CapturedMouseInterface,std::default_delete<ftxui::CapturedMouseInterface>>::
    unique_ptr<std::default_delete<ftxui::CapturedMouseInterface>,void>
              ((unique_ptr<ftxui::CapturedMouseInterface,std::default_delete<ftxui::CapturedMouseInterface>>
                *)this,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>,_true,_true>
          )(__uniq_ptr_data<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>,_true,_true>
            )this;
}

Assistant:

CapturedMouse ScreenInteractive::CaptureMouse() {
  if (mouse_captured)
    return nullptr;
  mouse_captured = true;
  return std::make_unique<CapturedMouseImpl>(
      [this] { mouse_captured = false; });
}